

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O1

int Mio_CommandReadProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__s;
  Mio_Library_t *pLib;
  FILE *__stream;
  char *pcVar2;
  size_t __size;
  
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if (pLib != (Mio_Library_t *)0x0) {
      pcVar2 = argv[globalUtilOptind];
      __stream = (FILE *)Io_FileOpen(pcVar2,"open_path","r",0);
      if (__stream == (FILE *)0x0) {
        fprintf(__s,"Cannot open input file \"%s\". ",pcVar2);
        pcVar2 = Extra_FileGetSimilarName
                           (pcVar2,".profile",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        if (pcVar2 != (char *)0x0) {
          fprintf(__s,"Did you mean \"%s\"?",pcVar2);
        }
        fputc(10,__s);
        return 1;
      }
      Mio_LibraryReadProfile((FILE *)__stream,pLib);
      fclose(__stream);
      return 0;
    }
    pcVar2 = "There is no Genlib library entered.\n";
    __size = 0x24;
  }
  else {
    fwrite("usage: read_profile [-h] <file>\n",0x20,1,__s);
    fwrite("\t          read a gate profile from a profile file\n",0x33,1,__s);
    fwrite("\t-h      : enable verbose output\n",0x21,1,__s);
    pcVar2 = "\t<file>  : file name to read the profile\n";
    __size = 0x29;
  }
  fwrite(pcVar2,__size,1,__s);
  return 1;
}

Assistant:

int Mio_CommandReadProfile( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile, * pOut, * pErr;
    Mio_Library_t * pLib;
    char * pFileName;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "h")) != EOF ) 
    {
        switch (c) 
        {
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
    {
        fprintf( pErr, "There is no Genlib library entered.\n" );
        return 1;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "r", 0 )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".profile", NULL, NULL, NULL, NULL )) )
            fprintf( pErr, "Did you mean \"%s\"?", pFileName );
        fprintf( pErr, "\n" );
        return 1;
    }

    // set the new network
    Mio_LibraryReadProfile( pFile, pLib );
    fclose( pFile );
    return 0;

usage:
    fprintf( pErr, "usage: read_profile [-h] <file>\n");
    fprintf( pErr, "\t          read a gate profile from a profile file\n" );  
    fprintf( pErr, "\t-h      : enable verbose output\n");
    fprintf( pErr, "\t<file>  : file name to read the profile\n");
    return 1;       
}